

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_malloc.c
# Opt level: O0

void ga_free(void *ptr)

{
  Boolean BVar1;
  long in_RDI;
  Integer handle;
  Integer in_stack_00000188;
  char *in_stack_00000190;
  Integer in_stack_ffffffffffffffe8;
  
  if (ga_usesMA == 0) {
    (*ga_ext_free)((void *)((in_RDI + -0x10) - *(long *)(in_RDI + -0x10)));
  }
  else {
    BVar1 = MA_pop_stack(in_stack_ffffffffffffffe8);
    if (BVar1 == 0) {
      pnga_error(in_stack_00000190,in_stack_00000188);
    }
  }
  return;
}

Assistant:

void ga_free(void *ptr)
{
    Integer handle;
    ptr = ((char*)ptr)-ALIGNMENT;
    handle= *((Integer*)ptr); /* retreive handle */

    if(ga_usesMA) {
      if(!MA_pop_stack(handle)) pnga_error("ga_free: MA_pop_stack failed",0);}
    else /*make sure to free original(before address alignment) pointer*/
      (*ga_ext_free)((char *)ptr - handle);
}